

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  _Bool _Var1;
  uint32_t uVar2;
  size_t n;
  long lVar3;
  size_t n_1;
  uint32_t letter_counts [26];
  char word [1024];
  
  for (lVar3 = 0; lVar3 != 0x1a; lVar3 = lVar3 + 1) {
    letter_counts[lVar3] = 0;
  }
  while( true ) {
    _Var1 = ask_word(word,6,0x400);
    if (!_Var1) break;
    count_letters(letter_counts,word);
  }
  uVar2 = max_count(letter_counts);
  printf("The most used letters are ");
  for (lVar3 = 0; lVar3 != 0x1a; lVar3 = lVar3 + 1) {
    if (letter_counts[lVar3] == uVar2) {
      printf("%c ",(ulong)((int)lVar3 + 0x41));
    }
  }
  printf("\nEach are used %u times.\n",(ulong)uVar2);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word[1024];
  uint32_t letter_counts[26];

  for (size_t n = 0; n < 26; n++) letter_counts[n] = 0;

  while (ask_word(word, 6, sizeof word)) {
    count_letters(letter_counts, word);
  }

  uint32_t max = max_count(letter_counts);

  printf("The most used letters are ");
  for (size_t n = 0; n < 26; n++) {
    if (letter_counts[n] == max) printf("%c ", 'A' + (char)n);
  }
  printf("\nEach are used %" PRIu32 " times.\n", max);

  return 0;
}